

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.cpp
# Opt level: O0

void camera_fun(int port)

{
  int __fd;
  int iVar1;
  reference __buf;
  ssize_t sVar2;
  _InputArray local_188;
  allocator local_169;
  string local_168 [32];
  _InputArray local_148;
  undefined1 local_130 [8];
  Mat frame_1;
  allocator<unsigned_char> local_b9;
  undefined1 local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buff;
  Mat frame;
  int count;
  int nLen;
  sockaddr_in addrSend;
  int ret_bind;
  int sockClient;
  sockaddr_in addrRec;
  int port_local;
  
  ret_bind._0_2_ = 2;
  addrRec.sin_zero._0_4_ = port;
  ret_bind._2_2_ = htons((uint16_t)port);
  sockClient = inet_addr("127.0.0.1");
  __fd = socket(2,2,0);
  if (__fd < 0) {
    printf("%d create socket fail\n",(ulong)(uint)addrRec.sin_zero._0_4_);
  }
  else {
    iVar1 = bind(__fd,(sockaddr *)&ret_bind,0x10);
    if (-1 < iVar1) {
      cv::Mat::Mat((Mat *)&buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      do {
        std::allocator<unsigned_char>::allocator(&local_b9);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,0x1000a,
                   &local_b9);
        std::allocator<unsigned_char>::~allocator(&local_b9);
        __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,0);
        sVar2 = recvfrom(__fd,__buf,0x1000a,0,(sockaddr *)0x0,(socklen_t *)0x0);
        if ((int)sVar2 == -1) {
          printf("recieve data fail!");
          cv::waitKey(10);
        }
        else {
          cv::_InputArray::_InputArray<unsigned_char>
                    (&local_148,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
          cv::imdecode((_InputArray *)local_130,(int)&local_148);
          cv::_InputArray::~_InputArray(&local_148);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_168,"receive",&local_169);
          cv::_InputArray::_InputArray(&local_188,(Mat *)local_130);
          cv::imshow(local_168,&local_188);
          cv::_InputArray::~_InputArray(&local_188);
          std::__cxx11::string::~string(local_168);
          std::allocator<char>::~allocator((allocator<char> *)&local_169);
          cv::waitKey(1);
          cv::Mat::~Mat((Mat *)local_130);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
      } while( true );
    }
    printf("%d bind fail\n",(ulong)(uint)addrRec.sin_zero._0_4_);
  }
  return;
}

Assistant:

void camera_fun(int port)
{				
	/*
		port为笔记本接收端口,注意和工控机发送端口保持一zhi
	*/
	struct sockaddr_in addrRec;
	addrRec.sin_family = AF_INET;
	addrRec.sin_port = htons(port);//port
	addrRec.sin_addr.s_addr = inet_addr("127.0.0.1");//ip
	
	int sockClient = socket(AF_INET, SOCK_DGRAM, 0);
	if(sockClient < 0){
		printf("%d create socket fail\n",port);
		return ;
	}

	int ret_bind = bind( sockClient, (struct sockaddr*)&addrRec, sizeof(sockaddr_in) );
    if(ret_bind < 0){
		printf("%d bind fail\n",port);
		return ;
	}

	struct sockaddr_in addrSend;
	int nLen = sizeof(struct sockaddr_in);
	int count;	
	Mat frame;
		
	while (1)
	{
		std::vector<uchar> buff(65546);
		count = recvfrom(sockClient,&buff[0],65546, 0, NULL,NULL);//接收压缩的数据
		if(count == -1){
			printf("recieve data fail!");
			waitKey(10);
			continue;

		}
		Mat frame = imdecode(buff, -1);//解压
		imshow("receive", frame);//显示
		waitKey(1);
	}	

	close(sockClient);

}